

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1ccb39::PeerManagerImpl::ProcessHeadersMessage
          (PeerManagerImpl *this,CNode *pfrom,Peer *peer,
          vector<CBlockHeader,_std::allocator<CBlockHeader>_> *headers,bool via_compact_block)

{
  long lVar1;
  pointer pCVar2;
  NodeId NVar3;
  string_view source_file;
  base_blob<256U> *pbVar4;
  pointer ppCVar5;
  bool bVar6;
  bool bVar7;
  CBlockIndex *pCVar8;
  CBlockIndex *pCVar9;
  CBlockIndex *pCVar10;
  Chainstate *pCVar11;
  Logger *pLVar12;
  HeadersSyncState *pHVar13;
  CNodeState *pCVar14;
  int64_t iVar15;
  base_uint<256U> *pbVar16;
  string *message;
  string *message_00;
  PeerManagerImpl *pPVar17;
  PeerManagerImpl *pPVar18;
  long lVar19;
  Level LVar20;
  arith_uint256 *b;
  char *nodeid;
  ChainstateManager *pCVar22;
  vector<CBlockHeader,_std::allocator<CBlockHeader>_> *__range1;
  pointer ppCVar23;
  CBlockHeader *header;
  pointer pCVar24;
  long in_FS_OFFSET;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view str;
  span<const_CBlockHeader,_18446744073709551615UL> headers_00;
  span<const_CBlockHeader,_18446744073709551615UL> headers_01;
  string_view logging_function_06;
  long *args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  CBlockIndex *pindexLast;
  NodeId local_188 [2];
  BlockValidationState state;
  string local_128;
  CBlockIndex *local_108 [4];
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock65;
  vector<CInv,_std::allocator<CInv>_> vGetData;
  vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_> vToFetch;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  undefined1 local_60 [8];
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock64;
  CNode *pCVar21;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar24 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  pCVar2 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar19 = (long)pCVar24 - (long)pCVar2;
  if (pCVar24 == pCVar2) {
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&state,&peer->m_headers_sync_mutex,
               "peer.m_headers_sync_mutex",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
               ,0xc00,false);
    if ((peer->m_headers_sync)._M_t.
        super___uniq_ptr_impl<HeadersSyncState,_std::default_delete<HeadersSyncState>_>._M_t.
        super__Tuple_impl<0UL,_HeadersSyncState_*,_std::default_delete<HeadersSyncState>_>.
        super__Head_base<0UL,_HeadersSyncState_*,_false>._M_head_impl != (HeadersSyncState *)0x0) {
      std::__uniq_ptr_impl<HeadersSyncState,_std::default_delete<HeadersSyncState>_>::reset
                ((__uniq_ptr_impl<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *)
                 &peer->m_headers_sync,(pointer)0x0);
      UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
                (&criticalblock68,&this->m_headers_presync_mutex,"m_headers_presync_mutex",
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
                 ,0xc03,false);
      criticalblock64.super_unique_lock._M_device = (mutex_type *)pfrom->id;
      std::
      _Rb_tree<long,_std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>,_std::_Select1st<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>_>
      ::erase(&(this->m_headers_presync_stats)._M_t,(key_type_conflict *)&criticalblock64);
      std::unique_lock<std::mutex>::~unique_lock(&criticalblock68.super_unique_lock);
    }
    (peer->m_last_getheaders_timestamp).__d.__r = 0;
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&state);
    goto LAB_001b66c1;
  }
  bVar6 = HasValidProofOfWork(headers,&this->m_chainparams->consensus);
  if (!bVar6) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&state,"header with invalid proof of work",
               (allocator<char> *)&criticalblock68);
    Misbehaving((PeerManagerImpl *)peer,(Peer *)&state,message);
LAB_001b66b7:
    std::__cxx11::string::~string((string *)&state);
    goto LAB_001b66c1;
  }
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity =
       0;
  state.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
  state.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p = (pointer)0x0
  ;
  pCVar2 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pCVar24 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
                 super__Vector_impl_data._M_start; pCVar24 != pCVar2; pCVar24 = pCVar24 + 1) {
    bVar6 = base_blob<256U>::IsNull((base_blob<256U> *)&state);
    if ((!bVar6) &&
       (bVar6 = operator!=(&(pCVar24->hashPrevBlock).super_base_blob<256U>,(base_blob<256U> *)&state
                          ), bVar6)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&state,"non-continuous headers sequence",
                 (allocator<char> *)&criticalblock68);
      Misbehaving((PeerManagerImpl *)peer,(Peer *)&state,message_00);
      goto LAB_001b66b7;
    }
    CBlockHeader::GetHash((uint256 *)&criticalblock68,pCVar24);
    state.super_ValidationState<BlockValidationResult>._0_8_ =
         criticalblock68.super_unique_lock._M_device;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)criticalblock68.super_unique_lock._8_8_;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
         local_70._M_allocated_capacity;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity
         = local_70._8_8_;
  }
  pindexLast = (CBlockIndex *)0x0;
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&state,&peer->m_headers_sync_mutex,
             "peer.m_headers_sync_mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
             ,0xc24,false);
  bVar6 = IsContinuationOfLowWorkHeadersSync(this,peer,pfrom,headers);
  pCVar24 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pCVar2 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pHVar13 = (peer->m_headers_sync)._M_t.
            super___uniq_ptr_impl<HeadersSyncState,_std::default_delete<HeadersSyncState>_>._M_t.
            super__Tuple_impl<0UL,_HeadersSyncState_*,_std::default_delete<HeadersSyncState>_>.
            super__Head_base<0UL,_HeadersSyncState_*,_false>._M_head_impl;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&state);
  if (pCVar24 == pCVar2) goto LAB_001b66c1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&state,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
             ,0xc3a,false);
  pPVar17 = this;
  pCVar8 = ::node::BlockManager::LookupBlockIndex
                     (&this->m_chainman->m_blockman,
                      &((headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>).
                        _M_impl.super__Vector_impl_data._M_start)->hashPrevBlock);
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&state);
  if (pCVar8 == (CBlockIndex *)0x0) {
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&state,&cs_main,"cs_main",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
               ,0xac7,false);
    pCVar8 = this->m_chainman->m_best_header;
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&state);
    GetLocator((CBlockLocator *)&state,pCVar8);
    pCVar21 = pfrom;
    bVar6 = MaybeSendGetHeaders(this,pfrom,(CBlockLocator *)&state,peer);
    LVar20 = (Level)pCVar21;
    std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
              ((_Vector_base<uint256,_std::allocator<uint256>_> *)&state);
    if ((bVar6) && (bVar6 = ::LogAcceptCategory(NET,LVar20), bVar6)) {
      CBlockHeader::GetHash
                ((uint256 *)local_108,
                 (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
                 super__Vector_impl_data._M_start);
      base_blob<256u>::ToString_abi_cxx11_((string *)&criticalblock65,(base_blob<256u> *)local_108);
      base_blob<256u>::ToString_abi_cxx11_
                (&local_128,
                 (base_blob<256u> *)
                 &((headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>).
                   _M_impl.super__Vector_impl_data._M_start)->hashPrevBlock);
      local_188[0] = pfrom->id;
      pLVar12 = LogInstance();
      bVar6 = BCLog::Logger::Enabled(pLVar12);
      if (bVar6) {
        state.super_ValidationState<BlockValidationResult>._0_8_ =
             &state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length;
        state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
             (pointer)0x0;
        state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
             state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length &
             0xffffffffffffff00;
        tinyformat::format<std::__cxx11::string,std::__cxx11::string,int,long>
                  ((string *)&criticalblock68,
                   (tinyformat *)
                   "received header %s: missing prev block %s, sending getheaders (%d) to end (peer=%d)\n"
                   ,(char *)&criticalblock65,&local_128,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &pCVar8->nHeight,(int *)local_188,(long *)in_stack_fffffffffffffe28);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&state,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &criticalblock68);
        std::__cxx11::string::~string((string *)&criticalblock68);
        pLVar12 = LogInstance();
        criticalblock68.super_unique_lock._M_device = (mutex_type *)0x5b;
        criticalblock68.super_unique_lock._8_8_ = anon_var_dwarf_1c8043;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
        ;
        source_file._M_len = 0x5b;
        str._M_str = (char *)state.super_ValidationState<BlockValidationResult>._0_8_;
        str._M_len = (size_t)state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                             _M_dataplus._M_p;
        logging_function_06._M_str = "HandleUnconnectingHeaders";
        logging_function_06._M_len = 0x19;
        BCLog::Logger::LogPrintStr(pLVar12,str,logging_function_06,source_file,0xacd,NET,Debug);
        std::__cxx11::string::~string((string *)&state);
      }
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&criticalblock65);
    }
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&criticalblock68,&cs_main,
               "cs_main",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
               ,0xad3,false);
    NVar3 = pfrom->id;
    CBlockHeader::GetHash
              ((uint256 *)&state,
               (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
               super__Vector_impl_data._M_finish + -1);
    UpdateBlockAvailability(pPVar17,NVar3,(uint256 *)&state);
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&criticalblock68);
    goto LAB_001b66c1;
  }
  (peer->m_last_getheaders_timestamp).__d.__r = 0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&criticalblock68,&cs_main,
             "cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
             ,0xc50,false);
  pCVar22 = this->m_chainman;
  CBlockHeader::GetHash
            ((uint256 *)&state,
             (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
             super__Vector_impl_data._M_finish + -1);
  pCVar9 = ::node::BlockManager::LookupBlockIndex(&pCVar22->m_blockman,(uint256 *)&state);
  pPVar18 = pPVar17;
  if (pCVar9 == (CBlockIndex *)0x0) {
    bVar7 = false;
  }
  else {
    pCVar22 = pPVar17->m_chainman;
    if (pCVar22->m_best_header != (CBlockIndex *)0x0) {
      pCVar10 = CBlockIndex::GetAncestor(pCVar22->m_best_header,pCVar9->nHeight);
      if (pCVar10 == pCVar9) {
        bVar7 = true;
        goto LAB_001b6936;
      }
      pCVar22 = pPVar17->m_chainman;
    }
    pCVar11 = ChainstateManager::ActiveChainstate(pCVar22);
    bVar7 = CChain::Contains(&pCVar11->m_chain,pCVar9);
  }
LAB_001b6936:
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&criticalblock68);
  if ((!bVar6 && bVar7 == false) && ((pfrom->m_permission_flags & NoBan) != NoBan)) {
    pCVar24 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
              super__Vector_impl_data._M_start;
    headers_00._M_extent._M_extent_value =
         ((long)(headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pCVar24) / 0x50;
    headers_00._M_ptr = pCVar24;
    CalculateClaimedHeadersWork((arith_uint256 *)&criticalblock64,headers_00);
    ::operator+((base_uint<256U> *)&criticalblock68,&(pCVar8->nChainWork).super_base_uint<256U>,
                (base_uint<256U> *)&criticalblock64);
    base_uint<256U>::base_uint((base_uint<256U> *)&state,(base_uint<256U> *)&criticalblock68);
    pbVar16 = (base_uint<256U> *)&criticalblock68;
    GetAntiDoSWorkThreshold((arith_uint256 *)pbVar16,pPVar17);
    pPVar17 = pPVar18;
    bVar6 = ::operator<((base_uint<256U> *)&state,pbVar16);
    pPVar18 = pPVar17;
    if (bVar6) {
      if ((long)(headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
                super__Vector_impl_data._M_start == 160000) {
        UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
                  (&criticalblock64,&peer->m_headers_sync_mutex,"peer.m_headers_sync_mutex",
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
                   ,0xb4d,false);
        pHVar13 = (HeadersSyncState *)operator_new(0x1e8);
        HeadersSyncState::HeadersSyncState
                  (pHVar13,peer->m_id,&pPVar17->m_chainparams->consensus,pCVar8,
                   (arith_uint256 *)&criticalblock68);
        std::__uniq_ptr_impl<HeadersSyncState,_std::default_delete<HeadersSyncState>_>::reset
                  ((__uniq_ptr_impl<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *)
                   &peer->m_headers_sync,pHVar13);
        IsContinuationOfLowWorkHeadersSync(pPVar17,peer,pfrom,headers);
        std::unique_lock<std::mutex>::~unique_lock(&criticalblock64.super_unique_lock);
      }
      else {
        bVar6 = ::LogAcceptCategory(NET,(Level)pbVar16);
        if (bVar6) {
          criticalblock64.super_unique_lock._M_device =
               (mutex_type *)
               (((long)(headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)(headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>).
                      _M_impl.super__Vector_impl_data._M_start) / 0x50 + (long)pCVar8->nHeight);
          vToFetch.super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)pfrom->id;
          source_file_03._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
          ;
          source_file_03._M_len = 0x5b;
          logging_function_02._M_str = "TryLowWorkHeadersSync";
          logging_function_02._M_len = 0x15;
          LogPrintf_<unsigned_long,long>
                    (logging_function_02,source_file_03,0xb56,
                     I2P|VALIDATION|QT|LIBEVENT|SELECTCOINS|ESTIMATEFEE|WALLETDB|ZMQ|HTTP|MEMPOOL|
                     TOR,(Level)&criticalblock64,(char *)&vToFetch,
                     (unsigned_long *)in_stack_fffffffffffffe28,(long *)pPVar17);
        }
      }
      std::vector<CBlockHeader,std::allocator<CBlockHeader>>::_M_assign_aux<CBlockHeader_const*>
                ((vector<CBlockHeader,std::allocator<CBlockHeader>> *)headers,0,0);
      goto LAB_001b66c1;
    }
  }
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)&state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2;
  state.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
  state.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity =
       state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
       _M_allocated_capacity & 0xffffffffffffff00;
  state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p =
       (pointer)&state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2;
  state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
  state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf[0] = '\0';
  pCVar24 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
            super__Vector_impl_data._M_start;
  headers_01._M_extent._M_extent_value =
       ((long)(headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)pCVar24) / 0x50;
  headers_01._M_ptr = pCVar24;
  bVar6 = ChainstateManager::ProcessNewBlockHeaders
                    (pPVar17->m_chainman,headers_01,true,&state,&pindexLast);
  if (bVar6 || state.super_ValidationState<BlockValidationResult>.m_mode != M_INVALID) {
    if (pindexLast == (CBlockIndex *)0x0) {
      __assert_fail("pindexLast",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
                    ,0xc78,
                    "void (anonymous namespace)::PeerManagerImpl::ProcessHeadersMessage(CNode &, Peer &, std::vector<CBlockHeader> &&, bool)"
                   );
    }
    if ((lVar19 == 160000) && (pHVar13 == (HeadersSyncState *)0x0)) {
      GetLocator((CBlockLocator *)&criticalblock68,pindexLast);
      pCVar21 = pfrom;
      bVar6 = MaybeSendGetHeaders(pPVar17,pfrom,(CBlockLocator *)&criticalblock68,peer);
      LVar20 = (Level)pCVar21;
      pPVar17 = pPVar18;
      std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
                ((_Vector_base<uint256,_std::allocator<uint256>_> *)&criticalblock68);
      pPVar18 = pPVar17;
      if (bVar6) {
        args_1 = (long *)0x1b6b79;
        bVar6 = ::LogAcceptCategory(NET,LVar20);
        if (bVar6) {
          criticalblock68.super_unique_lock._M_device = (mutex_type *)pfrom->id;
          source_file_00._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
          ;
          source_file_00._M_len = 0x5b;
          logging_function._M_str = "ProcessHeadersMessage";
          logging_function._M_len = 0x15;
          LogPrintf_<int,long,std::atomic<int>>
                    (logging_function,source_file_00,0xc7f,
                     I2P|VALIDATION|QT|LIBEVENT|SELECTCOINS|ZMQ|MEMPOOL|NET,
                     (Level)&pindexLast->nHeight,(char *)&criticalblock68,
                     (int *)&peer->m_starting_height,args_1,(atomic<int> *)in_stack_fffffffffffffe28
                    );
        }
      }
    }
    pCVar8 = pindexLast;
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&criticalblock64,&cs_main,
               "cs_main",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
               ,0xbc5,false);
    NVar3 = pfrom->id;
    pCVar14 = State(pPVar17,NVar3);
    CBlockIndex::GetBlockHash((uint256 *)&criticalblock68,pCVar8);
    UpdateBlockAvailability(pPVar17,NVar3,(uint256 *)&criticalblock68);
    if (pCVar9 == (CBlockIndex *)0x0) {
      pCVar11 = ChainstateManager::ActiveChainstate(pPVar18->m_chainman);
      bVar6 = operator>(&(pCVar8->nChainWork).super_base_uint<256U>,
                        &((pCVar11->m_chain).vChain.
                          super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                          super__Vector_impl_data._M_finish[-1]->nChainWork).super_base_uint<256U>);
      if (bVar6) {
        iVar15 = GetTime();
        pCVar14->m_last_block_announcement = iVar15;
      }
    }
    bVar6 = ChainstateManager::IsInitialBlockDownload(pPVar18->m_chainman);
    if ((bVar6 && lVar19 != 160000) &&
       (pCVar8 = pCVar14->pindexBestKnownBlock, pCVar8 != (CBlockIndex *)0x0)) {
      pbVar16 = &ChainstateManager::MinimumChainWork(pPVar18->m_chainman)->super_base_uint<256U>;
      bVar6 = ::operator<(&(pCVar8->nChainWork).super_base_uint<256U>,pbVar16);
      if ((bVar6) && (bVar6 = CNode::IsOutboundOrBlockRelayConn(pfrom), bVar6)) {
        criticalblock68.super_unique_lock._M_device = (mutex_type *)pfrom->id;
        source_file_01._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
        ;
        source_file_01._M_len = 0x5b;
        logging_function_00._M_str = "UpdatePeerStateForReceivedHeaders";
        logging_function_00._M_len = 0x21;
        LogPrintf_<long>(logging_function_00,source_file_01,0xbe1,ALL,Info,
                         "Disconnecting outbound peer %d -- headers chain has insufficient work\n",
                         (long *)&criticalblock68);
        LOCK();
        (pfrom->fDisconnect)._M_base._M_i = true;
        UNLOCK();
      }
    }
    pPVar17 = pPVar18;
    if ((((((pfrom->fDisconnect)._M_base._M_i & 1U) == 0) &&
         (pfrom->m_conn_type == OUTBOUND_FULL_RELAY)) &&
        (pCVar8 = pCVar14->pindexBestKnownBlock, pCVar8 != (CBlockIndex *)0x0)) &&
       (pPVar18->m_outbound_peers_with_protect_from_disconnect < 4)) {
      pCVar11 = ChainstateManager::ActiveChainstate(pPVar18->m_chainman);
      b = &(pCVar11->m_chain).vChain.
           super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
           super__Vector_impl_data._M_finish[-1]->nChainWork;
      bVar6 = operator>=(&(pCVar8->nChainWork).super_base_uint<256U>,&b->super_base_uint<256U>);
      pPVar17 = pPVar18;
      if ((bVar6) && ((pCVar14->m_chain_sync).m_protect == false)) {
        bVar6 = ::LogAcceptCategory(NET,(Level)b);
        pPVar17 = pPVar18;
        if (bVar6) {
          criticalblock68.super_unique_lock._M_device = (mutex_type *)pfrom->id;
          source_file_02._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
          ;
          source_file_02._M_len = 0x5b;
          logging_function_01._M_str = "UpdatePeerStateForReceivedHeaders";
          logging_function_01._M_len = 0x21;
          LogPrintf_<long>(logging_function_01,source_file_02,0xbee,NET,Debug,
                           "Protecting outbound peer=%d from eviction\n",(long *)&criticalblock68);
        }
        (pCVar14->m_chain_sync).m_protect = true;
        pPVar18->m_outbound_peers_with_protect_from_disconnect =
             pPVar18->m_outbound_peers_with_protect_from_disconnect + 1;
      }
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&criticalblock64);
    pCVar8 = pindexLast;
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (&criticalblock65,&cs_main,"cs_main",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
               ,0xb83,false);
    pPVar18 = pPVar17;
    pCVar14 = State(pPVar17,pfrom->id);
    bVar6 = CanDirectFetch(pPVar17);
    if ((bVar6) && ((pCVar8->nStatus & 6) != 0 && (pCVar8->nStatus & 0x60) == 0)) {
      pCVar11 = ChainstateManager::ActiveChainstate(pPVar17->m_chainman);
      bVar6 = operator<=(&((pCVar11->m_chain).vChain.
                           super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl
                           .super__Vector_impl_data._M_finish[-1]->nChainWork).super_base_uint<256U>
                         ,&(pCVar8->nChainWork).super_base_uint<256U>);
      if (bVar6) {
        vToFetch.super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vToFetch.super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        vToFetch.super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        for (local_108[0] = pCVar8; local_108[0] != (CBlockIndex *)0x0;
            local_108[0] = local_108[0]->pprev) {
          pCVar11 = ChainstateManager::ActiveChainstate(pPVar17->m_chainman);
          bVar6 = CChain::Contains(&pCVar11->m_chain,local_108[0]);
          if ((bVar6) ||
             (0x80 < (ulong)((long)vToFetch.
                                   super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)vToFetch.
                                  super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start))) break;
          if ((local_108[0]->nStatus & 8) == 0) {
            CBlockIndex::GetBlockHash((uint256 *)&criticalblock68,local_108[0]);
            bVar6 = IsBlockRequested(pPVar17,(uint256 *)&criticalblock68);
            if ((!bVar6) &&
               ((bVar6 = DeploymentActiveAt<Consensus::BuriedDeployment>
                                   (local_108[0],pPVar17->m_chainman,DEPLOYMENT_SEGWIT), !bVar6 ||
                (((peer->m_their_services)._M_i & NODE_WITNESS) != NODE_NONE)))) {
              std::vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>::push_back
                        (&vToFetch,local_108);
            }
          }
        }
        pCVar11 = ChainstateManager::ActiveChainstate(pPVar17->m_chainman);
        nodeid = (char *)local_108[0];
        bVar6 = CChain::Contains(&pCVar11->m_chain,local_108[0]);
        ppCVar5 = vToFetch.
                  super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (bVar6) {
          vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          ppCVar23 = vToFetch.
                     super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          while ((ppCVar23 != ppCVar5 &&
                 ((pCVar14->vBlocksInFlight).
                  super__List_base<(anonymous_namespace)::QueuedBlock,_std::allocator<(anonymous_namespace)::QueuedBlock>_>
                  ._M_impl._M_node._M_size < 0x10))) {
            pCVar9 = ppCVar23[-1];
            criticalblock64.super_unique_lock._M_device =
                 (mutex_type *)
                 (CONCAT44(criticalblock64.super_unique_lock._M_device._4_4_,
                           ((uint)(peer->m_their_services)._M_i & 8) << 0x1b) | 2);
            CBlockIndex::GetBlockHash((uint256 *)&criticalblock68,pCVar9);
            std::vector<CInv,std::allocator<CInv>>::emplace_back<unsigned_int,uint256>
                      ((vector<CInv,std::allocator<CInv>> *)&vGetData,(uint *)&criticalblock64,
                       (uint256 *)&criticalblock68);
            nodeid = (char *)pfrom->id;
            BlockRequested(pPVar18,(NodeId)nodeid,pCVar9,(iterator **)0x0);
            bVar6 = ::LogAcceptCategory(NET,(Level)nodeid);
            ppCVar23 = ppCVar23 + -1;
            if (bVar6) {
              CBlockIndex::GetBlockHash((uint256 *)&criticalblock64,pCVar9);
              base_blob<256u>::ToString_abi_cxx11_
                        ((string *)&criticalblock68,(base_blob<256u> *)&criticalblock64);
              local_128._M_dataplus._M_p = (pointer)pfrom->id;
              source_file_04._M_str =
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
              ;
              source_file_04._M_len = 0x5b;
              logging_function_03._M_str = "HeadersDirectFetchBlocks";
              logging_function_03._M_len = 0x18;
              nodeid = "HeadersDirectFetchBlocks";
              LogPrintf_<std::__cxx11::string,long>
                        (logging_function_03,source_file_04,0xba7,NET,Debug,
                         "Requesting block %s from  peer=%d\n",(string *)&criticalblock68,
                         (long *)&local_128);
              std::__cxx11::string::~string((string *)&criticalblock68);
            }
          }
          if ((1 < (ulong)(((long)vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                                 super__Vector_impl_data._M_start) / 0x24)) &&
             (pPVar17 = pPVar18, bVar6 = ::LogAcceptCategory(NET,(Level)nodeid), bVar6)) {
            CBlockIndex::GetBlockHash((uint256 *)&criticalblock64,pCVar8);
            base_blob<256u>::ToString_abi_cxx11_
                      ((string *)&criticalblock68,(base_blob<256u> *)&criticalblock64);
            source_file_06._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
            ;
            source_file_06._M_len = 0x5b;
            logging_function_05._M_str = "HeadersDirectFetchBlocks";
            logging_function_05._M_len = 0x18;
            LogPrintf_<std::__cxx11::string,int>
                      (logging_function_05,source_file_06,0xbac,
                       I2P|VALIDATION|QT|LIBEVENT|SELECTCOINS|ADDRMAN|RPC|WALLETDB|HTTP|TOR|NET,
                       (Level)(string *)&criticalblock68,(char *)&pCVar8->nHeight,
                       in_stack_fffffffffffffe28,(int *)pPVar17);
            pPVar18 = pPVar17;
            std::__cxx11::string::~string((string *)&criticalblock68);
          }
          if (vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
              super__Vector_impl_data._M_start) {
            if (((((pPVar18->m_opts).ignore_incoming_txs == false) &&
                 ((long)vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                        super__Vector_impl_data._M_start == 0x24)) &&
                (pCVar14->m_provides_cmpctblocks != false)) &&
               (((pPVar18->mapBlocksInFlight)._M_t._M_impl.super__Rb_tree_header._M_node_count == 1
                && ((pCVar8->pprev->nStatus & 100) == 4)))) {
              CInv::CInv((CInv *)&criticalblock68,4,
                         &(vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                           super__Vector_impl_data._M_start)->hash);
              *(undefined4 *)
               (((vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                  super__Vector_impl_data._M_start)->hash).super_base_blob<256U>.m_data._M_elems +
               0x1c) = local_60._0_4_;
              *(size_type *)
               (((vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                  super__Vector_impl_data._M_start)->hash).super_base_blob<256U>.m_data._M_elems +
               0xc) = local_70._M_allocated_capacity;
              *(undefined8 *)
               (((vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                  super__Vector_impl_data._M_start)->hash).super_base_blob<256U>.m_data._M_elems +
               0x14) = local_70._8_8_;
              *(mutex_type **)
               vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
               super__Vector_impl_data._M_start = criticalblock68.super_unique_lock._M_device;
              pbVar4 = &((vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                          super__Vector_impl_data._M_start)->hash).super_base_blob<256U>;
              (pbVar4->m_data)._M_elems[4] = criticalblock68.super_unique_lock._M_owns;
              (pbVar4->m_data)._M_elems[5] = criticalblock68.super_unique_lock._9_1_;
              (pbVar4->m_data)._M_elems[6] = criticalblock68.super_unique_lock._10_1_;
              (pbVar4->m_data)._M_elems[7] = criticalblock68.super_unique_lock._11_1_;
              (pbVar4->m_data)._M_elems[8] = criticalblock68.super_unique_lock._12_1_;
              (pbVar4->m_data)._M_elems[9] = criticalblock68.super_unique_lock._13_1_;
              (pbVar4->m_data)._M_elems[10] = criticalblock68.super_unique_lock._14_1_;
              (pbVar4->m_data)._M_elems[0xb] = criticalblock68.super_unique_lock._15_1_;
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&criticalblock68,"getdata",(allocator<char> *)&criticalblock64);
            (anonymous_namespace)::PeerManagerImpl::
            MakeAndPushMessage<std::vector<CInv,std::allocator<CInv>>&>
                      ((PeerManagerImpl *)pPVar18,pfrom,(string *)&criticalblock68,&vGetData);
            std::__cxx11::string::~string((string *)&criticalblock68);
          }
          std::_Vector_base<CInv,_std::allocator<CInv>_>::~_Vector_base
                    (&vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>);
        }
        else {
          bVar6 = ::LogAcceptCategory(NET,(Level)nodeid);
          if (bVar6) {
            CBlockIndex::GetBlockHash((uint256 *)&criticalblock64,pCVar8);
            base_blob<256u>::ToString_abi_cxx11_
                      ((string *)&criticalblock68,(base_blob<256u> *)&criticalblock64);
            source_file_05._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
            ;
            source_file_05._M_len = 0x5b;
            logging_function_04._M_str = "HeadersDirectFetchBlocks";
            logging_function_04._M_len = 0x18;
            LogPrintf_<std::__cxx11::string,int>
                      (logging_function_04,source_file_05,0xb9a,
                       I2P|VALIDATION|QT|LIBEVENT|SELECTCOINS|ADDRMAN|WALLETDB|ZMQ|BENCH|HTTP|
                       MEMPOOL,(Level)(string *)&criticalblock68,(char *)&pCVar8->nHeight,
                       in_stack_fffffffffffffe28,(int *)pPVar18);
            std::__cxx11::string::~string((string *)&criticalblock68);
          }
        }
        std::_Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>::~_Vector_base
                  (&vToFetch.
                    super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>);
      }
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock65.super_unique_lock);
  }
  else {
    NVar3 = pfrom->id;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&criticalblock68,"invalid header received",
               (allocator<char> *)&criticalblock64);
    MaybePunishNodeForBlock(pPVar18,NVar3,&state,via_compact_block,(string *)&criticalblock68);
    std::__cxx11::string::~string((string *)&criticalblock68);
  }
  ValidationState<BlockValidationResult>::~ValidationState
            (&state.super_ValidationState<BlockValidationResult>);
LAB_001b66c1:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PeerManagerImpl::ProcessHeadersMessage(CNode& pfrom, Peer& peer,
                                            std::vector<CBlockHeader>&& headers,
                                            bool via_compact_block)
{
    size_t nCount = headers.size();

    if (nCount == 0) {
        // Nothing interesting. Stop asking this peers for more headers.
        // If we were in the middle of headers sync, receiving an empty headers
        // message suggests that the peer suddenly has nothing to give us
        // (perhaps it reorged to our chain). Clear download state for this peer.
        LOCK(peer.m_headers_sync_mutex);
        if (peer.m_headers_sync) {
            peer.m_headers_sync.reset(nullptr);
            LOCK(m_headers_presync_mutex);
            m_headers_presync_stats.erase(pfrom.GetId());
        }
        // A headers message with no headers cannot be an announcement, so assume
        // it is a response to our last getheaders request, if there is one.
        peer.m_last_getheaders_timestamp = {};
        return;
    }

    // Before we do any processing, make sure these pass basic sanity checks.
    // We'll rely on headers having valid proof-of-work further down, as an
    // anti-DoS criteria (note: this check is required before passing any
    // headers into HeadersSyncState).
    if (!CheckHeadersPoW(headers, m_chainparams.GetConsensus(), peer)) {
        // Misbehaving() calls are handled within CheckHeadersPoW(), so we can
        // just return. (Note that even if a header is announced via compact
        // block, the header itself should be valid, so this type of error can
        // always be punished.)
        return;
    }

    const CBlockIndex *pindexLast = nullptr;

    // We'll set already_validated_work to true if these headers are
    // successfully processed as part of a low-work headers sync in progress
    // (either in PRESYNC or REDOWNLOAD phase).
    // If true, this will mean that any headers returned to us (ie during
    // REDOWNLOAD) can be validated without further anti-DoS checks.
    bool already_validated_work = false;

    // If we're in the middle of headers sync, let it do its magic.
    bool have_headers_sync = false;
    {
        LOCK(peer.m_headers_sync_mutex);

        already_validated_work = IsContinuationOfLowWorkHeadersSync(peer, pfrom, headers);

        // The headers we passed in may have been:
        // - untouched, perhaps if no headers-sync was in progress, or some
        //   failure occurred
        // - erased, such as if the headers were successfully processed and no
        //   additional headers processing needs to take place (such as if we
        //   are still in PRESYNC)
        // - replaced with headers that are now ready for validation, such as
        //   during the REDOWNLOAD phase of a low-work headers sync.
        // So just check whether we still have headers that we need to process,
        // or not.
        if (headers.empty()) {
            return;
        }

        have_headers_sync = !!peer.m_headers_sync;
    }

    // Do these headers connect to something in our block index?
    const CBlockIndex *chain_start_header{WITH_LOCK(::cs_main, return m_chainman.m_blockman.LookupBlockIndex(headers[0].hashPrevBlock))};
    bool headers_connect_blockindex{chain_start_header != nullptr};

    if (!headers_connect_blockindex) {
        // This could be a BIP 130 block announcement, use
        // special logic for handling headers that don't connect, as this
        // could be benign.
        HandleUnconnectingHeaders(pfrom, peer, headers);
        return;
    }

    // If headers connect, assume that this is in response to any outstanding getheaders
    // request we may have sent, and clear out the time of our last request. Non-connecting
    // headers cannot be a response to a getheaders request.
    peer.m_last_getheaders_timestamp = {};

    // If the headers we received are already in memory and an ancestor of
    // m_best_header or our tip, skip anti-DoS checks. These headers will not
    // use any more memory (and we are not leaking information that could be
    // used to fingerprint us).
    const CBlockIndex *last_received_header{nullptr};
    {
        LOCK(cs_main);
        last_received_header = m_chainman.m_blockman.LookupBlockIndex(headers.back().GetHash());
        if (IsAncestorOfBestHeaderOrTip(last_received_header)) {
            already_validated_work = true;
        }
    }

    // If our peer has NetPermissionFlags::NoBan privileges, then bypass our
    // anti-DoS logic (this saves bandwidth when we connect to a trusted peer
    // on startup).
    if (pfrom.HasPermission(NetPermissionFlags::NoBan)) {
        already_validated_work = true;
    }

    // At this point, the headers connect to something in our block index.
    // Do anti-DoS checks to determine if we should process or store for later
    // processing.
    if (!already_validated_work && TryLowWorkHeadersSync(peer, pfrom,
                chain_start_header, headers)) {
        // If we successfully started a low-work headers sync, then there
        // should be no headers to process any further.
        Assume(headers.empty());
        return;
    }

    // At this point, we have a set of headers with sufficient work on them
    // which can be processed.

    // If we don't have the last header, then this peer will have given us
    // something new (if these headers are valid).
    bool received_new_header{last_received_header == nullptr};

    // Now process all the headers.
    BlockValidationState state;
    if (!m_chainman.ProcessNewBlockHeaders(headers, /*min_pow_checked=*/true, state, &pindexLast)) {
        if (state.IsInvalid()) {
            MaybePunishNodeForBlock(pfrom.GetId(), state, via_compact_block, "invalid header received");
            return;
        }
    }
    assert(pindexLast);

    // Consider fetching more headers if we are not using our headers-sync mechanism.
    if (nCount == MAX_HEADERS_RESULTS && !have_headers_sync) {
        // Headers message had its maximum size; the peer may have more headers.
        if (MaybeSendGetHeaders(pfrom, GetLocator(pindexLast), peer)) {
            LogDebug(BCLog::NET, "more getheaders (%d) to end to peer=%d (startheight:%d)\n",
                    pindexLast->nHeight, pfrom.GetId(), peer.m_starting_height);
        }
    }

    UpdatePeerStateForReceivedHeaders(pfrom, peer, *pindexLast, received_new_header, nCount == MAX_HEADERS_RESULTS);

    // Consider immediately downloading blocks.
    HeadersDirectFetchBlocks(pfrom, peer, *pindexLast);

    return;
}